

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer_device.cpp
# Opt level: O0

Vec3fa embree::MetalMaterial__eval
                 (ISPCMetalMaterial *This,BRDF *brdf,Vec3fa *wo,DifferentialGeometry *dg,Vec3fa *wi)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined1 auVar16 [16];
  undefined8 uVar17;
  undefined8 *in_RCX;
  long in_RSI;
  FresnelConductor *in_RDI;
  long in_R8;
  undefined8 *in_R9;
  float fVar18;
  float fVar19;
  float fVar20;
  undefined8 uVar21;
  undefined1 auVar22 [16];
  float fVar23;
  Vec3fa VVar24;
  float G;
  float D;
  Vec3fa F;
  float cosTheta;
  float cosThetaH;
  Vec3fa wh;
  float cosThetaI;
  float cosThetaO;
  PowerCosineDistribution distribution;
  FresnelConductor fresnel;
  __m128 r_2;
  __m128 a_7;
  __m128 r;
  __m128 a;
  __m128 c_3;
  __m128 r_1;
  __m128 a_4;
  vfloat4 c_2;
  vfloat4 b_2;
  vfloat4 a_3;
  vfloat4 c;
  vfloat4 b;
  vfloat4 a_1;
  vfloat4 c_1;
  vfloat4 b_1;
  vfloat4 a_2;
  vfloat4 c_4;
  vfloat4 b_3;
  vfloat4 a_5;
  vfloat4 c_5;
  vfloat4 b_4;
  vfloat4 a_6;
  float in_stack_ffffffffffffea0c;
  undefined4 in_stack_ffffffffffffea10;
  float in_stack_ffffffffffffea14;
  undefined8 local_1588;
  undefined8 uStack_1580;
  undefined8 local_1568;
  undefined8 uStack_1560;
  undefined8 local_1558;
  undefined8 uStack_1550;
  float local_1544;
  float local_1540;
  float local_153c;
  undefined8 local_1538;
  undefined8 uStack_1530;
  undefined8 local_1528;
  undefined8 uStack_1520;
  undefined8 *local_14f8;
  long local_14f0;
  undefined8 *local_14e8;
  long local_14d8;
  undefined1 local_1408 [16];
  ulong local_13f8;
  undefined8 uStack_13f0;
  float local_13dc;
  undefined8 local_13d8;
  undefined8 uStack_13d0;
  undefined8 *local_13c8;
  undefined8 *local_13c0;
  undefined8 local_13b8;
  undefined8 uStack_13b0;
  undefined8 *local_13a8;
  undefined8 *local_13a0;
  undefined8 local_1398;
  undefined8 uStack_1390;
  undefined8 *local_1388;
  undefined8 *local_1380;
  undefined8 local_1378;
  undefined8 uStack_1370;
  undefined8 *local_1360;
  undefined8 *local_1358;
  undefined8 *local_1310;
  undefined8 *local_1308;
  undefined8 *local_1300;
  undefined8 *local_12e8;
  undefined8 *local_12e0;
  undefined8 *local_12d8;
  undefined8 *local_12d0;
  undefined8 *local_12b8;
  undefined8 *local_12b0;
  undefined8 *local_12a8;
  undefined8 *local_12a0;
  undefined8 *local_1298;
  undefined8 *local_1290;
  undefined8 *local_1288;
  undefined8 *local_1280;
  undefined8 *local_1278;
  undefined8 *local_1270;
  undefined8 *local_1268;
  undefined8 *local_1260;
  undefined8 *local_11f8;
  undefined8 *local_11f0;
  undefined8 local_11e8;
  undefined8 uStack_11e0;
  float local_11cc;
  undefined8 *local_11c8;
  undefined8 *local_11c0;
  undefined8 local_11b8;
  undefined8 uStack_11b0;
  undefined8 *local_11a8;
  undefined8 *local_11a0;
  float local_1194;
  undefined8 *local_1190;
  ulong local_1188;
  undefined8 uStack_1180;
  undefined1 local_1178 [16];
  ulong local_1168;
  undefined8 uStack_1160;
  float local_114c;
  undefined8 *local_1148;
  undefined8 *local_1140;
  undefined8 *local_1138;
  undefined8 *local_1130;
  undefined8 *local_1128;
  undefined8 *local_1120;
  undefined1 local_1118 [16];
  undefined4 local_10fc;
  undefined1 local_10f8 [16];
  undefined4 local_10dc;
  undefined1 local_10d8 [16];
  float local_10bc;
  undefined1 local_10b8 [16];
  undefined4 local_109c;
  undefined1 local_1098 [16];
  float local_107c;
  ulong local_1038;
  undefined8 uStack_1030;
  ulong local_1018;
  undefined8 uStack_1010;
  undefined8 local_1008;
  undefined8 uStack_1000;
  undefined8 local_fe8;
  undefined8 uStack_fe0;
  ulong local_fd8;
  undefined8 uStack_fd0;
  undefined8 local_fc8;
  undefined8 uStack_fc0;
  undefined8 local_fb8;
  undefined8 uStack_fb0;
  undefined8 local_fa8;
  undefined8 uStack_fa0;
  ulong local_f98;
  undefined8 uStack_f90;
  undefined8 local_f88;
  undefined8 uStack_f80;
  ulong local_f78;
  undefined8 uStack_f70;
  undefined8 local_f68;
  undefined8 uStack_f60;
  ulong local_f58;
  undefined8 uStack_f50;
  ulong local_f48;
  undefined8 uStack_f40;
  undefined8 local_f38;
  undefined8 uStack_f30;
  ulong local_f28;
  undefined8 uStack_f20;
  undefined8 local_f18;
  undefined8 uStack_f10;
  float local_ed8;
  undefined8 local_ec8;
  undefined8 uStack_ec0;
  ulong local_eb8;
  undefined8 uStack_eb0;
  undefined8 local_e88;
  undefined8 uStack_e80;
  undefined8 local_e78;
  undefined8 uStack_e70;
  undefined8 local_e68;
  undefined8 uStack_e60;
  undefined8 local_e58;
  undefined8 uStack_e50;
  undefined8 local_e48;
  undefined8 uStack_e40;
  undefined8 *local_e30;
  undefined8 local_e28;
  undefined8 uStack_e20;
  undefined8 local_e18;
  undefined8 uStack_e10;
  undefined8 local_e08;
  undefined8 uStack_e00;
  undefined8 local_df8;
  undefined8 uStack_df0;
  undefined8 local_de8;
  undefined8 uStack_de0;
  undefined8 local_dd8;
  undefined8 uStack_dd0;
  undefined8 *local_dc0;
  undefined8 local_db8;
  undefined8 uStack_db0;
  undefined8 local_da8;
  undefined8 uStack_da0;
  undefined8 local_d98;
  undefined8 uStack_d90;
  undefined8 local_d88;
  undefined8 uStack_d80;
  undefined8 local_d78;
  undefined8 uStack_d70;
  undefined8 local_d68;
  undefined8 uStack_d60;
  undefined8 *local_d50;
  undefined8 local_d48;
  undefined8 uStack_d40;
  undefined8 local_d38;
  undefined8 uStack_d30;
  undefined8 local_d28;
  undefined8 uStack_d20;
  undefined8 local_d18;
  undefined8 uStack_d10;
  undefined8 local_d08;
  undefined8 uStack_d00;
  undefined8 local_cf8;
  undefined8 uStack_cf0;
  undefined8 *local_ce0;
  undefined8 local_cd8;
  undefined8 uStack_cd0;
  undefined8 local_cc8;
  undefined8 uStack_cc0;
  undefined8 local_cb8;
  undefined8 uStack_cb0;
  undefined8 local_ca8;
  undefined8 uStack_ca0;
  undefined8 local_c98;
  undefined8 uStack_c90;
  undefined8 local_c88;
  undefined8 uStack_c80;
  undefined8 *local_c70;
  undefined8 local_c68;
  undefined8 uStack_c60;
  undefined8 local_c58;
  undefined8 uStack_c50;
  undefined8 *local_c40;
  undefined8 local_c38;
  undefined8 uStack_c30;
  undefined8 *local_c20;
  undefined8 local_c18;
  undefined8 uStack_c10;
  undefined8 *local_c00;
  undefined8 local_bf8;
  undefined8 uStack_bf0;
  undefined8 *local_be0;
  undefined8 local_bd8;
  undefined8 uStack_bd0;
  undefined8 *local_bc8;
  undefined8 *local_bc0;
  undefined8 *local_bb8;
  undefined8 *local_bb0;
  undefined8 *local_ba8;
  undefined8 *local_ba0;
  undefined8 *local_b98;
  undefined8 *local_b90;
  undefined8 *local_b88;
  undefined8 *local_b80;
  undefined8 *local_b78;
  undefined8 *local_b70;
  undefined8 *local_b68;
  undefined8 *local_b60;
  undefined8 *local_b58;
  undefined8 *local_b50;
  undefined8 *local_b48;
  undefined8 *local_b40;
  undefined8 *local_b38;
  undefined8 *local_b30;
  undefined8 *local_b28;
  undefined8 *local_b20;
  undefined8 *local_b18;
  undefined8 *local_b10;
  float local_b08;
  float fStack_b04;
  float fStack_b00;
  float fStack_afc;
  undefined8 *local_af8;
  undefined8 *local_af0;
  undefined8 *local_ae8;
  undefined8 *local_ae0;
  float local_ad8;
  float fStack_ad4;
  float fStack_ad0;
  float fStack_acc;
  undefined8 *local_ac8;
  undefined8 *local_ac0;
  undefined8 *local_ab8;
  undefined8 *local_ab0;
  float local_aa8;
  float fStack_aa4;
  float fStack_aa0;
  float fStack_a9c;
  undefined8 *local_a98;
  undefined8 *local_a90;
  undefined8 *local_a88;
  undefined8 *local_a80;
  float local_a78;
  float fStack_a74;
  float fStack_a70;
  float fStack_a6c;
  undefined8 *local_a68;
  undefined8 *local_a60;
  undefined8 *local_a58;
  undefined8 *local_a50;
  float local_a48;
  float fStack_a44;
  float fStack_a40;
  float fStack_a3c;
  undefined8 *local_a38;
  undefined8 *local_a30;
  undefined8 *local_a28;
  undefined8 *local_a20;
  float local_a18;
  float fStack_a14;
  float fStack_a10;
  float fStack_a0c;
  undefined8 *local_a08;
  undefined8 *local_a00;
  undefined8 *local_9f8;
  undefined8 *local_9f0;
  float local_9e8;
  float fStack_9e4;
  float fStack_9e0;
  float fStack_9dc;
  undefined8 *local_9d8;
  undefined8 *local_9d0;
  undefined8 *local_9c8;
  undefined8 *local_9c0;
  float local_9b8;
  float fStack_9b4;
  float fStack_9b0;
  float fStack_9ac;
  undefined8 *local_9a8;
  undefined8 *local_9a0;
  undefined8 *local_998;
  undefined8 *local_990;
  float local_988;
  float fStack_984;
  float fStack_980;
  float fStack_97c;
  undefined8 *local_978;
  undefined8 *local_970;
  undefined8 *local_968;
  undefined8 *local_960;
  float local_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  undefined8 *local_948;
  undefined8 *local_940;
  undefined8 *local_938;
  undefined8 *local_930;
  undefined8 *local_928;
  undefined8 *local_920;
  undefined8 *local_918;
  undefined8 *local_910;
  undefined8 local_908;
  undefined8 uStack_900;
  undefined8 *local_8f0;
  undefined8 *local_8e8;
  undefined8 *local_8e0;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  undefined8 *local_8c0;
  undefined8 *local_8b8;
  undefined8 *local_8b0;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined8 *local_890;
  undefined8 *local_888;
  undefined8 *local_880;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined8 *local_860;
  undefined8 *local_858;
  undefined8 *local_850;
  undefined8 local_848;
  undefined8 uStack_840;
  undefined8 *local_830;
  float local_828;
  float fStack_824;
  float fStack_820;
  float fStack_81c;
  float local_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float local_808;
  float fStack_804;
  float fStack_800;
  float fStack_7fc;
  float local_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float local_7e8;
  float fStack_7e4;
  float fStack_7e0;
  float fStack_7dc;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 *local_780;
  undefined8 *local_778;
  undefined8 *local_770;
  undefined8 *local_768;
  undefined8 *local_760;
  undefined8 *local_758;
  undefined8 *local_750;
  undefined8 *local_748;
  undefined8 *local_740;
  undefined8 *local_738;
  undefined8 *local_730;
  undefined8 *local_728;
  undefined8 *local_720;
  undefined8 *local_718;
  undefined8 *local_710;
  undefined8 *local_708;
  undefined8 *local_700;
  undefined8 *local_6f8;
  undefined8 *local_6f0;
  undefined8 *local_6e8;
  undefined8 *local_6e0;
  undefined8 *local_6d8;
  undefined8 *local_6d0;
  undefined8 *local_6c8;
  undefined8 *local_6c0;
  undefined8 *local_6b8;
  undefined8 *local_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined8 *local_690;
  float local_688;
  float fStack_684;
  float fStack_680;
  float fStack_67c;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 *local_660;
  undefined8 *local_658;
  undefined8 *local_650;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 *local_630;
  float local_628;
  float fStack_624;
  float fStack_620;
  float fStack_61c;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 *local_600;
  undefined8 *local_5f8;
  undefined8 *local_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 *local_5d0;
  float local_5c8;
  float fStack_5c4;
  float fStack_5c0;
  float fStack_5bc;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 *local_5a0;
  undefined8 *local_598;
  undefined8 *local_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 *local_570;
  float local_568;
  float fStack_564;
  float fStack_560;
  float fStack_55c;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 *local_540;
  undefined8 *local_538;
  undefined8 *local_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 *local_510;
  float local_508;
  float fStack_504;
  float fStack_500;
  float fStack_4fc;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 *local_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float local_35c;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  undefined8 *local_2c0;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  undefined8 *local_2a0;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  undefined8 *local_200;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  undefined8 *local_1e0;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  undefined8 *local_1c0;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  undefined8 *local_1a0;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  undefined8 *local_180;
  ulong local_178;
  undefined8 uStack_170;
  ulong local_168;
  undefined8 uStack_160;
  ulong local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_12e8 = (undefined8 *)(in_RSI + 0x20);
  local_12e0 = &local_1528;
  local_1528 = *local_12e8;
  uStack_1520 = *(undefined8 *)(in_RSI + 0x28);
  local_12d8 = (undefined8 *)(in_RSI + 0x30);
  local_12d0 = &local_1538;
  local_1538 = *local_12d8;
  uStack_1530 = *(undefined8 *)(in_RSI + 0x38);
  local_14f8 = in_R9;
  local_14f0 = in_R8;
  local_14e8 = in_RCX;
  local_14d8 = in_RSI;
  make_FresnelConductor
            (&in_RDI->eta,(Vec3fa *)CONCAT44(in_stack_ffffffffffffea14,in_stack_ffffffffffffea10));
  local_13dc = *(float *)(local_14d8 + 0x40);
  local_1098._4_4_ = 0;
  local_1098._0_4_ = local_13dc;
  local_13f8 = local_1098._0_8_;
  uStack_13f0 = 0;
  local_1038 = local_1098._0_8_;
  uStack_1030 = 0;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = local_1098._0_8_;
  local_1408 = rcpss(auVar22,auVar22);
  local_109c = 0x40000000;
  local_10b8 = ZEXT416(0x40000000);
  local_f28 = local_1098._0_8_;
  uStack_f20 = 0;
  local_f18._0_4_ = local_1408._0_4_;
  fVar19 = (float)local_f18;
  local_f18._4_4_ = local_1408._4_4_;
  local_f18._0_4_ = (float)local_f18 * local_13dc;
  uStack_1000 = local_1408._8_8_;
  local_ec8 = local_f18;
  fVar18 = 2.0 - (float)local_f18;
  local_eb8 = (ulong)(uint)fVar18;
  uStack_eb0 = 0;
  local_f48 = local_eb8;
  uStack_f40 = 0;
  fVar19 = fVar19 * fVar18;
  local_f38 = CONCAT44(local_f18._4_4_,fVar19);
  local_1008 = local_f38;
  local_1098 = ZEXT416((uint)local_13dc);
  local_107c = local_13dc;
  uStack_f30 = uStack_1000;
  uStack_f10 = uStack_1000;
  uStack_ec0 = uStack_1000;
  local_153c = (float)make_PowerCosineDistribution(fVar19);
  local_1360 = (undefined8 *)(local_14f0 + 0x40);
  local_1358 = local_14e8;
  local_12a8 = &local_1378;
  local_12b0 = local_14e8;
  uVar21 = *local_14e8;
  uVar1 = local_14e8[1];
  uVar2 = *local_1360;
  uVar3 = *(undefined8 *)(local_14f0 + 0x48);
  local_18._0_4_ = (float)uVar21;
  local_18._4_4_ = (float)((ulong)uVar21 >> 0x20);
  uStack_10._0_4_ = (float)uVar1;
  uStack_10._4_4_ = (float)((ulong)uVar1 >> 0x20);
  local_28._0_4_ = (float)uVar2;
  local_28._4_4_ = (float)((ulong)uVar2 >> 0x20);
  uStack_20._0_4_ = (float)uVar3;
  uStack_20._4_4_ = (float)((ulong)uVar3 >> 0x20);
  local_1b8 = (float)local_18 * (float)local_28;
  local_7f8 = local_18._4_4_ * local_28._4_4_;
  local_628 = (float)uStack_10 * (float)uStack_20;
  fStack_1ac = uStack_10._4_4_ * uStack_20._4_4_;
  local_bf8 = CONCAT44(local_7f8,local_1b8);
  uStack_bf0 = CONCAT44(fStack_1ac,local_628);
  local_be0 = &local_dd8;
  local_b88 = &local_de8;
  local_8d8 = CONCAT44(local_7f8,local_7f8);
  uStack_8d0 = CONCAT44(local_7f8,local_7f8);
  local_b38 = &local_df8;
  local_648 = CONCAT44(local_628,local_628);
  uStack_640 = CONCAT44(local_628,local_628);
  local_9f8 = &local_e18;
  local_9b8 = local_1b8 + local_7f8;
  fStack_9b4 = local_7f8 + local_7f8;
  fStack_9b0 = local_628 + local_7f8;
  fStack_9ac = fStack_1ac + local_7f8;
  local_468 = CONCAT44(fStack_9b4,local_9b8);
  uStack_460 = CONCAT44(fStack_9ac,fStack_9b0);
  local_9f0 = &local_e08;
  local_1540 = local_9b8 + local_628;
  fStack_9e4 = fStack_9b4 + local_628;
  fStack_9e0 = fStack_9b0 + local_628;
  fStack_9dc = fStack_9ac + local_628;
  local_db8 = CONCAT44(fStack_9e4,local_1540);
  uStack_db0 = CONCAT44(fStack_9dc,fStack_9e0);
  local_1388 = (undefined8 *)(local_14f0 + 0x40);
  local_1380 = local_14f8;
  local_1290 = &local_1398;
  local_1298 = local_14f8;
  uVar4 = *local_14f8;
  uVar5 = local_14f8[1];
  uVar6 = *local_1388;
  uVar7 = *(undefined8 *)(local_14f0 + 0x48);
  local_38._0_4_ = (float)uVar4;
  local_38._4_4_ = (float)((ulong)uVar4 >> 0x20);
  uStack_30._0_4_ = (float)uVar5;
  uStack_30._4_4_ = (float)((ulong)uVar5 >> 0x20);
  local_48._0_4_ = (float)uVar6;
  local_48._4_4_ = (float)((ulong)uVar6 >> 0x20);
  uStack_40._0_4_ = (float)uVar7;
  uStack_40._4_4_ = (float)((ulong)uVar7 >> 0x20);
  local_1d8 = (float)local_38 * (float)local_48;
  local_808 = local_38._4_4_ * local_48._4_4_;
  local_5c8 = (float)uStack_30 * (float)uStack_40;
  fStack_1cc = uStack_30._4_4_ * uStack_40._4_4_;
  local_c18 = CONCAT44(local_808,local_1d8);
  uStack_c10 = CONCAT44(fStack_1cc,local_5c8);
  local_c00 = &local_d68;
  local_b98 = &local_d78;
  local_8a8 = CONCAT44(local_808,local_808);
  uStack_8a0 = CONCAT44(local_808,local_808);
  local_b48 = &local_d88;
  local_5e8 = CONCAT44(local_5c8,local_5c8);
  uStack_5e0 = CONCAT44(local_5c8,local_5c8);
  local_a58 = &local_da8;
  local_a18 = local_1d8 + local_808;
  fStack_a14 = local_808 + local_808;
  fStack_a10 = local_5c8 + local_808;
  fStack_a0c = fStack_1cc + local_808;
  local_428 = CONCAT44(fStack_a14,local_a18);
  uStack_420 = CONCAT44(fStack_a0c,fStack_a10);
  local_a50 = &local_d98;
  local_1544 = local_a18 + local_5c8;
  fStack_a44 = fStack_a14 + local_5c8;
  fStack_a40 = fStack_a10 + local_5c8;
  fStack_a3c = fStack_a0c + local_5c8;
  local_d48 = CONCAT44(fStack_a44,local_1544);
  uStack_d40 = CONCAT44(fStack_a3c,fStack_a40);
  if ((local_1544 <= 0.0) || (local_1540 <= 0.0)) {
    uVar21 = 0;
    *(undefined8 *)&(in_RDI->eta).field_0 = 0;
    *(undefined8 *)((long)&(in_RDI->eta).field_0 + 8) = 0;
    fVar19 = local_5c8;
  }
  else {
    local_1300 = &local_1568;
    local_1308 = local_14f8;
    local_1310 = local_14e8;
    uVar8 = *local_14f8;
    uVar9 = local_14f8[1];
    uVar10 = *local_14e8;
    uVar11 = local_14e8[1];
    local_388._0_4_ = (float)uVar8;
    local_388._4_4_ = (float)((ulong)uVar8 >> 0x20);
    uStack_380._0_4_ = (float)uVar9;
    uStack_380._4_4_ = (float)((ulong)uVar9 >> 0x20);
    local_398._0_4_ = (float)uVar10;
    local_398._4_4_ = (float)((ulong)uVar10 >> 0x20);
    uStack_390._0_4_ = (float)uVar11;
    uStack_390._4_4_ = (float)((ulong)uVar11 >> 0x20);
    local_198 = (float)local_388 + (float)local_398;
    fStack_194 = local_388._4_4_ + local_398._4_4_;
    fStack_190 = (float)uStack_380 + (float)uStack_390;
    fStack_18c = uStack_380._4_4_ + uStack_390._4_4_;
    local_138 = CONCAT44(fStack_194,local_198);
    uStack_130 = CONCAT44(fStack_18c,fStack_190);
    local_13c8 = &local_1558;
    local_1138 = &local_11b8;
    local_2b8 = local_198 * local_198;
    local_7e8 = fStack_194 * fStack_194;
    local_688 = fStack_190 * fStack_190;
    fStack_2ac = fStack_18c * fStack_18c;
    local_bd8 = CONCAT44(local_7e8,local_2b8);
    uStack_bd0 = CONCAT44(fStack_2ac,local_688);
    local_bc8 = &local_e48;
    local_b78 = &local_e58;
    local_908 = CONCAT44(local_7e8,local_7e8);
    uStack_900 = CONCAT44(local_7e8,local_7e8);
    local_b28 = &local_e68;
    local_6a8 = CONCAT44(local_688,local_688);
    uStack_6a0 = CONCAT44(local_688,local_688);
    local_998 = &local_e88;
    local_958 = local_2b8 + local_7e8;
    fStack_954 = local_7e8 + local_7e8;
    fStack_950 = local_688 + local_7e8;
    fStack_94c = fStack_2ac + local_7e8;
    local_4a8 = CONCAT44(fStack_954,local_958);
    uStack_4a0 = CONCAT44(fStack_94c,fStack_950);
    local_990 = &local_e78;
    local_114c = local_958 + local_688;
    fStack_984 = fStack_954 + local_688;
    fStack_980 = fStack_950 + local_688;
    fStack_97c = fStack_94c + local_688;
    local_e28 = CONCAT44(fStack_984,local_114c);
    uStack_e20 = CONCAT44(fStack_97c,fStack_980);
    local_10d8 = ZEXT416((uint)local_114c);
    local_1168 = CONCAT44(0,local_114c);
    uStack_1160 = 0;
    uStack_170 = 0;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = local_1168;
    local_1178 = rsqrtss(auVar16,auVar16);
    local_10dc = 0x3fc00000;
    local_10f8 = ZEXT416(0x3fc00000);
    local_f68 = local_1178._0_8_;
    uVar17 = local_f68;
    uStack_f60 = local_1178._8_8_;
    local_f68._0_4_ = local_1178._0_4_;
    local_f58 = (ulong)(uint)((float)local_f68 * 1.5);
    uStack_f50 = 0;
    local_10fc = 0xbf000000;
    local_1118 = ZEXT416(0xbf000000);
    local_f88 = local_1118._0_8_;
    uStack_f80 = 0;
    local_f78 = (ulong)(uint)(local_114c * -0.5);
    uStack_f70 = 0;
    local_fa8 = local_1178._0_8_;
    uStack_fa0 = local_1178._8_8_;
    local_11cc = local_114c * -0.5 * (float)local_f68;
    local_f98 = (ulong)(uint)local_11cc;
    uStack_f90 = 0;
    local_fc8 = local_1178._0_8_;
    uStack_fc0 = local_1178._8_8_;
    local_fb8 = CONCAT44(local_1178._4_4_,(float)local_f68 * (float)local_f68);
    local_fe8 = local_fb8;
    local_11cc = local_11cc * (float)local_f68 * (float)local_f68;
    local_fd8 = (ulong)(uint)local_11cc;
    uStack_fd0 = 0;
    local_168 = local_fd8;
    uStack_160 = 0;
    local_11cc = (float)local_f68 * 1.5 + local_11cc;
    local_158 = (ulong)(uint)local_11cc;
    uStack_150 = 0;
    local_1188 = local_158;
    uStack_1180 = 0;
    local_1018 = local_158;
    uStack_1010 = 0;
    local_1190 = &local_11e8;
    local_148 = CONCAT44(local_11cc,local_11cc);
    uStack_140 = CONCAT44(local_11cc,local_11cc);
    local_2d8 = local_198 * local_11cc;
    fStack_2d4 = fStack_194 * local_11cc;
    fStack_2d0 = fStack_190 * local_11cc;
    fStack_2cc = fStack_18c * local_11cc;
    local_88 = CONCAT44(fStack_2d4,local_2d8);
    uStack_80 = CONCAT44(fStack_2cc,fStack_2d0);
    local_13a8 = (undefined8 *)(local_14f0 + 0x40);
    local_1278 = &local_13b8;
    uVar12 = *local_13a8;
    uVar13 = *(undefined8 *)(local_14f0 + 0x48);
    local_68._0_4_ = (float)uVar12;
    local_68._4_4_ = (float)((ulong)uVar12 >> 0x20);
    uStack_60._0_4_ = (float)uVar13;
    uStack_60._4_4_ = (float)((ulong)uVar13 >> 0x20);
    local_1f8 = local_2d8 * (float)local_68;
    local_818 = fStack_2d4 * local_68._4_4_;
    local_568 = fStack_2d0 * (float)uStack_60;
    fStack_1ec = fStack_2cc * uStack_60._4_4_;
    local_c38 = CONCAT44(local_818,local_1f8);
    uStack_c30 = CONCAT44(fStack_1ec,local_568);
    local_c20 = &local_cf8;
    local_ba8 = &local_d08;
    local_878 = CONCAT44(local_818,local_818);
    uStack_870 = CONCAT44(local_818,local_818);
    local_b58 = &local_d18;
    local_588 = CONCAT44(local_568,local_568);
    uStack_580 = CONCAT44(local_568,local_568);
    local_ab8 = &local_d38;
    local_a78 = local_1f8 + local_818;
    fStack_a74 = local_818 + local_818;
    fStack_a70 = local_568 + local_818;
    fStack_a6c = fStack_1ec + local_818;
    local_3e8 = CONCAT44(fStack_a74,local_a78);
    uStack_3e0 = CONCAT44(fStack_a6c,fStack_a70);
    local_ab0 = &local_d28;
    fVar19 = local_a78 + local_568;
    fStack_aa4 = fStack_a74 + local_568;
    fStack_aa0 = fStack_a70 + local_568;
    fStack_a9c = fStack_a6c + local_568;
    local_cd8 = CONCAT44(fStack_aa4,fVar19);
    uStack_cd0 = CONCAT44(fStack_a9c,fStack_aa0);
    local_13c0 = local_14f8;
    local_1260 = &local_13d8;
    local_1268 = local_14f8;
    uVar14 = *local_14f8;
    uVar15 = local_14f8[1];
    local_78._0_4_ = (float)uVar14;
    local_78._4_4_ = (float)((ulong)uVar14 >> 0x20);
    uStack_70._0_4_ = (float)uVar15;
    uStack_70._4_4_ = (float)((ulong)uVar15 >> 0x20);
    local_218 = (float)local_78 * local_2d8;
    local_828 = local_78._4_4_ * fStack_2d4;
    local_508 = (float)uStack_70 * fStack_2d0;
    fStack_20c = uStack_70._4_4_ * fStack_2cc;
    local_c58 = CONCAT44(local_828,local_218);
    uStack_c50 = CONCAT44(fStack_20c,local_508);
    local_c40 = &local_c88;
    local_bb8 = &local_c98;
    local_848 = CONCAT44(local_828,local_828);
    uStack_840 = CONCAT44(local_828,local_828);
    local_b68 = &local_ca8;
    local_528 = CONCAT44(local_508,local_508);
    uStack_520 = CONCAT44(local_508,local_508);
    local_b18 = &local_cc8;
    local_ad8 = local_218 + local_828;
    fStack_ad4 = local_828 + local_828;
    fStack_ad0 = local_508 + local_828;
    fStack_acc = fStack_20c + local_828;
    local_3a8 = CONCAT44(fStack_ad4,local_ad8);
    uStack_3a0 = CONCAT44(fStack_acc,fStack_ad0);
    local_b10 = &local_cb8;
    fVar18 = local_ad8 + local_508;
    fStack_b04 = fStack_ad4 + local_508;
    fStack_b00 = fStack_ad0 + local_508;
    fStack_afc = fStack_acc + local_508;
    local_c68 = CONCAT44(fStack_b04,fVar18);
    uStack_c60 = CONCAT44(fStack_afc,fStack_b00);
    local_13a0 = local_13c8;
    local_12b8 = local_1360;
    local_12a0 = local_1388;
    local_1288 = local_13a8;
    local_1280 = local_13c8;
    local_1270 = local_13c8;
    local_11f8 = local_1300;
    local_11f0 = local_13c8;
    local_11c8 = local_1300;
    local_11c0 = local_13c8;
    local_11a8 = local_1300;
    local_11a0 = local_1300;
    local_1194 = local_11cc;
    local_1148 = local_1300;
    local_1140 = local_1300;
    local_1130 = local_1190;
    local_1128 = local_1300;
    local_1120 = local_13c8;
    local_10bc = local_114c;
    uStack_fe0 = local_1178._8_8_;
    uStack_fb0 = local_1178._8_8_;
    local_f68 = uVar17;
    local_e30 = local_1138;
    local_dc0 = local_12a8;
    local_d50 = local_1290;
    local_ce0 = local_1278;
    local_c70 = local_1260;
    local_bc0 = local_c40;
    local_bb0 = local_c20;
    local_ba0 = local_c00;
    local_b90 = local_be0;
    local_b80 = local_bc8;
    local_b70 = local_c40;
    local_b60 = local_c20;
    local_b50 = local_c00;
    local_b40 = local_be0;
    local_b30 = local_bc8;
    local_b20 = local_b68;
    local_b08 = fVar18;
    local_af8 = local_b10;
    local_af0 = local_bb8;
    local_ae8 = local_c40;
    local_ae0 = local_b18;
    local_ac8 = local_b18;
    local_ac0 = local_b58;
    local_aa8 = fVar19;
    local_a98 = local_ab0;
    local_a90 = local_ba8;
    local_a88 = local_c20;
    local_a80 = local_ab8;
    local_a68 = local_ab8;
    local_a60 = local_b48;
    local_a48 = local_1544;
    local_a38 = local_a50;
    local_a30 = local_b98;
    local_a28 = local_c00;
    local_a20 = local_a58;
    local_a08 = local_a58;
    local_a00 = local_b38;
    local_9e8 = local_1540;
    local_9d8 = local_9f0;
    local_9d0 = local_b88;
    local_9c8 = local_be0;
    local_9c0 = local_9f8;
    local_9a8 = local_9f8;
    local_9a0 = local_b28;
    local_988 = local_114c;
    local_978 = local_990;
    local_970 = local_b78;
    local_968 = local_bc8;
    local_960 = local_998;
    local_948 = local_998;
    local_940 = local_b10;
    local_938 = local_ab0;
    local_930 = local_a50;
    local_928 = local_9f0;
    local_920 = local_990;
    local_918 = local_bc8;
    local_910 = local_b78;
    local_8f0 = local_b78;
    local_8e8 = local_be0;
    local_8e0 = local_b88;
    local_8c0 = local_b88;
    local_8b8 = local_c00;
    local_8b0 = local_b98;
    local_890 = local_b98;
    local_888 = local_c20;
    local_880 = local_ba8;
    local_860 = local_ba8;
    local_858 = local_c40;
    local_850 = local_bb8;
    local_830 = local_bb8;
    fStack_824 = local_828;
    fStack_820 = local_828;
    fStack_81c = local_828;
    fStack_814 = local_818;
    fStack_810 = local_818;
    fStack_80c = local_818;
    fStack_804 = local_808;
    fStack_800 = local_808;
    fStack_7fc = local_808;
    fStack_7f4 = local_7f8;
    fStack_7f0 = local_7f8;
    fStack_7ec = local_7f8;
    fStack_7e4 = local_7e8;
    fStack_7e0 = local_7e8;
    fStack_7dc = local_7e8;
    local_7d8 = local_c58;
    uStack_7d0 = uStack_c50;
    local_7c8 = local_c38;
    uStack_7c0 = uStack_c30;
    local_7b8 = local_c18;
    uStack_7b0 = uStack_c10;
    local_7a8 = local_bf8;
    uStack_7a0 = uStack_bf0;
    local_798 = local_bd8;
    uStack_790 = uStack_bd0;
    local_780 = local_c40;
    local_778 = local_c20;
    local_770 = local_c00;
    local_768 = local_be0;
    local_760 = local_bc8;
    local_758 = local_b78;
    local_750 = local_bc8;
    local_748 = local_b28;
    local_740 = local_998;
    local_738 = local_b88;
    local_730 = local_be0;
    local_728 = local_b38;
    local_720 = local_9f8;
    local_718 = local_b98;
    local_710 = local_c00;
    local_708 = local_b48;
    local_700 = local_a58;
    local_6f8 = local_ba8;
    local_6f0 = local_c20;
    local_6e8 = local_b58;
    local_6e0 = local_ab8;
    local_6d8 = local_bb8;
    local_6d0 = local_c40;
    local_6c8 = local_b68;
    local_6c0 = local_b18;
    local_6b8 = local_bc8;
    local_6b0 = local_b28;
    local_690 = local_b28;
    fStack_684 = local_688;
    fStack_680 = local_688;
    fStack_67c = local_688;
    local_678 = local_bd8;
    uStack_670 = uStack_bd0;
    local_660 = local_bc8;
    local_658 = local_be0;
    local_650 = local_b38;
    local_630 = local_b38;
    fStack_624 = local_628;
    fStack_620 = local_628;
    fStack_61c = local_628;
    local_618 = local_bf8;
    uStack_610 = uStack_bf0;
    local_600 = local_be0;
    local_5f8 = local_c00;
    local_5f0 = local_b48;
    local_5d0 = local_b48;
    fStack_5c4 = local_5c8;
    fStack_5c0 = local_5c8;
    fStack_5bc = local_5c8;
    local_5b8 = local_c18;
    uStack_5b0 = uStack_c10;
    local_5a0 = local_c00;
    local_598 = local_c20;
    local_590 = local_b58;
    local_570 = local_b58;
    fStack_564 = local_568;
    fStack_560 = local_568;
    fStack_55c = local_568;
    local_558 = local_c38;
    uStack_550 = uStack_c30;
    local_540 = local_c20;
    local_538 = local_c40;
    local_530 = local_b68;
    local_510 = local_b68;
    fStack_504 = local_508;
    fStack_500 = local_508;
    fStack_4fc = local_508;
    local_4f8 = local_c58;
    uStack_4f0 = uStack_c50;
    local_4e0 = local_c40;
    local_4d8 = local_908;
    uStack_4d0 = uStack_900;
    local_4c8 = local_bd8;
    uStack_4c0 = uStack_bd0;
    local_4b8 = local_6a8;
    uStack_4b0 = uStack_6a0;
    local_498 = local_8d8;
    uStack_490 = uStack_8d0;
    local_488 = local_bf8;
    uStack_480 = uStack_bf0;
    local_478 = local_648;
    uStack_470 = uStack_640;
    local_458 = local_8a8;
    uStack_450 = uStack_8a0;
    local_448 = local_c18;
    uStack_440 = uStack_c10;
    local_438 = local_5e8;
    uStack_430 = uStack_5e0;
    local_418 = local_878;
    uStack_410 = uStack_870;
    local_408 = local_c38;
    uStack_400 = uStack_c30;
    local_3f8 = local_588;
    uStack_3f0 = uStack_580;
    local_3d8 = local_848;
    uStack_3d0 = uStack_840;
    local_3c8 = local_c58;
    uStack_3c0 = uStack_c50;
    local_3b8 = local_528;
    uStack_3b0 = uStack_520;
    local_398 = uVar10;
    uStack_390 = uVar11;
    local_388 = uVar8;
    uStack_380 = uVar9;
    local_378 = local_11cc;
    fStack_374 = local_11cc;
    fStack_370 = local_11cc;
    fStack_36c = local_11cc;
    local_35c = local_11cc;
    local_2c0 = local_13c8;
    fStack_2b4 = local_7e8;
    fStack_2b0 = local_688;
    local_2a0 = local_1138;
    fStack_214 = local_828;
    fStack_210 = local_508;
    local_200 = local_1260;
    fStack_1f4 = local_818;
    fStack_1f0 = local_568;
    local_1e0 = local_1278;
    fStack_1d4 = local_808;
    fStack_1d0 = local_5c8;
    local_1c0 = local_1290;
    fStack_1b4 = local_7f8;
    fStack_1b0 = local_628;
    local_1a0 = local_12a8;
    local_180 = local_1300;
    local_178 = local_1168;
    local_128 = local_138;
    uStack_120 = uStack_130;
    local_118 = local_138;
    uStack_110 = uStack_130;
    local_78 = uVar14;
    uStack_70 = uVar15;
    local_68 = uVar12;
    uStack_60 = uVar13;
    local_58 = local_88;
    uStack_50 = uStack_80;
    local_48 = uVar6;
    uStack_40 = uVar7;
    local_38 = uVar4;
    uStack_30 = uVar5;
    local_28 = uVar2;
    uStack_20 = uVar3;
    local_18 = uVar21;
    uStack_10 = uVar1;
    local_1568 = local_138;
    uStack_1560 = uStack_130;
    local_1558 = local_88;
    uStack_1550 = uStack_80;
    local_13d8 = local_c58;
    uStack_13d0 = uStack_c50;
    local_13b8 = local_c38;
    uStack_13b0 = uStack_c30;
    local_1398 = local_c18;
    uStack_1390 = uStack_c10;
    local_1378 = local_bf8;
    uStack_1370 = uStack_bf0;
    local_11e8 = local_148;
    uStack_11e0 = uStack_140;
    local_11b8 = local_bd8;
    uStack_11b0 = uStack_bd0;
    local_e88 = local_4a8;
    uStack_e80 = uStack_4a0;
    local_e78 = local_e28;
    uStack_e70 = uStack_e20;
    local_e68 = local_6a8;
    uStack_e60 = uStack_6a0;
    local_e58 = local_908;
    uStack_e50 = uStack_900;
    local_e48 = local_bd8;
    uStack_e40 = uStack_bd0;
    local_e18 = local_468;
    uStack_e10 = uStack_460;
    local_e08 = local_db8;
    uStack_e00 = uStack_db0;
    local_df8 = local_648;
    uStack_df0 = uStack_640;
    local_de8 = local_8d8;
    uStack_de0 = uStack_8d0;
    local_dd8 = local_bf8;
    uStack_dd0 = uStack_bf0;
    local_da8 = local_428;
    uStack_da0 = uStack_420;
    local_d98 = local_d48;
    uStack_d90 = uStack_d40;
    local_d88 = local_5e8;
    uStack_d80 = uStack_5e0;
    local_d78 = local_8a8;
    uStack_d70 = uStack_8a0;
    local_d68 = local_c18;
    uStack_d60 = uStack_c10;
    local_d38 = local_3e8;
    uStack_d30 = uStack_3e0;
    local_d28 = local_cd8;
    uStack_d20 = uStack_cd0;
    local_d18 = local_588;
    uStack_d10 = uStack_580;
    local_d08 = local_878;
    uStack_d00 = uStack_870;
    local_cf8 = local_c38;
    uStack_cf0 = uStack_c30;
    local_cc8 = local_3a8;
    uStack_cc0 = uStack_3a0;
    local_cb8 = local_c68;
    uStack_cb0 = uStack_c60;
    local_ca8 = local_528;
    uStack_ca0 = uStack_520;
    local_c98 = local_848;
    uStack_c90 = uStack_840;
    local_c88 = local_c58;
    uStack_c80 = uStack_c50;
    eval(in_RDI,in_stack_ffffffffffffea14);
    fVar20 = eval((PowerCosineDistribution *)
                  CONCAT44(in_stack_ffffffffffffea14,in_stack_ffffffffffffea10),
                  in_stack_ffffffffffffea0c);
    fVar23 = (fVar19 * 2.0 * local_1540) / fVar18;
    fVar18 = (fVar19 * 2.0 * local_1544) / fVar18;
    if (fVar23 < fVar18) {
      fVar18 = fVar23;
    }
    if (1.0 < fVar18) {
      fVar18 = 1.0;
    }
    local_f8 = (float)*(undefined8 *)(local_14d8 + 0x10);
    fStack_f4 = (float)((ulong)*(undefined8 *)(local_14d8 + 0x10) >> 0x20);
    fStack_f0 = (float)*(undefined8 *)(local_14d8 + 0x18);
    fStack_ec = (float)((ulong)*(undefined8 *)(local_14d8 + 0x18) >> 0x20);
    local_108 = (float)local_1588;
    fStack_104 = (float)((ulong)local_1588 >> 0x20);
    fStack_100 = (float)uStack_1580;
    fStack_fc = (float)((ulong)uStack_1580 >> 0x20);
    local_5c8 = local_f8 * local_108 * fVar20 * fVar18;
    fVar19 = fStack_f4 * fStack_104 * fVar20 * fVar18;
    local_1540 = local_1540 * 4.0;
    auVar22 = rcpss(ZEXT416((uint)local_1540),ZEXT416((uint)local_1540));
    local_ed8 = auVar22._0_4_;
    local_ed8 = local_ed8 * (2.0 - local_ed8 * local_1540);
    uVar21 = CONCAT44(fVar19 * local_ed8,local_5c8 * local_ed8);
    *(undefined8 *)&(in_RDI->eta).field_0 = uVar21;
    *(ulong *)((long)&(in_RDI->eta).field_0 + 8) =
         CONCAT44(fStack_ec * fStack_fc * fVar20 * fVar18 * local_ed8,
                  fStack_f0 * fStack_100 * fVar20 * fVar18 * local_ed8);
  }
  VVar24.field_0.m128[3] = fVar19;
  VVar24.field_0.m128[2] = local_5c8;
  VVar24.field_0._0_8_ = uVar21;
  return (Vec3fa)VVar24.field_0;
}

Assistant:

Vec3fa MetalMaterial__eval(ISPCMetalMaterial* This, const BRDF& brdf, const Vec3fa& wo, const DifferentialGeometry& dg, const Vec3fa& wi)
{
  const FresnelConductor fresnel = make_FresnelConductor(Vec3fa(This->eta),Vec3fa(This->k));
  const PowerCosineDistribution distribution = make_PowerCosineDistribution(rcp(This->roughness));

  const float cosThetaO = dot(wo,dg.Ns);
  const float cosThetaI = dot(wi,dg.Ns);
  if (cosThetaI <= 0.0f || cosThetaO <= 0.0f) return Vec3fa(0.f);
  const Vec3fa wh = normalize(wi+wo);
  const float cosThetaH = dot(wh, dg.Ns);
  const float cosTheta = dot(wi, wh); // = dot(wo, wh);
  const Vec3fa F = eval(fresnel,cosTheta);
  const float D = eval(distribution,cosThetaH);
  const float G = min(1.0f, min(2.0f * cosThetaH * cosThetaO / cosTheta,
                                2.0f * cosThetaH * cosThetaI / cosTheta));
  return (Vec3fa(This->reflectance)*F) * D * G * rcp(4.0f*cosThetaO);
}